

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
GlassMaterial::sample
          (GlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Vector3f *pVVar4;
  Ray *this_01;
  result_type rVar5;
  Ray *v;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_XMM5 [16];
  Vector3f np;
  Vector3f local_d4;
  Vector3f *local_c8;
  Ray *local_c0;
  undefined1 local_b4 [12];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vector3f local_84;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Vector2f local_4c;
  Vector2f local_44;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  this_00 = rt->g;
  v = (Ray *)&ray->d;
  local_c8 = coe;
  local_c0 = ray;
  operator-((Vector3f *)v);
  auVar8._0_4_ = Vector3f::dot(&local_d4,&hit->norm);
  auVar8._4_60_ = extraout_var;
  local_78 = auVar8._0_16_;
  local_98 = ZEXT416((uint)this->thickness);
  auVar7._0_8_ = CONCAT44(extraout_var._0_4_,auVar8._0_4_) ^ 0x8000000080000000;
  auVar7._8_4_ = extraout_var._4_4_ ^ 0x80000000;
  auVar7._12_4_ = extraout_var._8_4_ ^ 0x80000000;
  local_a8 = vmaxss_avx(auVar7,local_78);
  local_68._0_8_ = local_a8._0_8_ ^ 0x8000000080000000;
  local_68._8_4_ = local_a8._8_4_ ^ 0x80000000;
  local_68._12_4_ = local_a8._12_4_ ^ 0x80000000;
  auVar7 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),local_a8,local_a8);
  auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,auVar7);
  if (auVar7._0_4_ < 0.0) {
    fVar6 = sqrtf(auVar7._0_4_);
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar6 = auVar7._0_4_;
  }
  auVar7 = ZEXT416((uint)(fVar6 * this->refractCoef));
  auVar7 = vfnmadd213ss_fma(auVar7,auVar7,ZEXT416(0x3f800000));
  if (auVar7._0_4_ < 0.0) {
    auVar9._0_4_ = sqrtf(auVar7._0_4_);
    auVar9._4_60_ = extraout_var_00;
    auVar7 = auVar9._0_16_;
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
  }
  fVar6 = this->refractCoef;
  auVar3 = vfmadd231ss_fma(local_68,ZEXT416((uint)fVar6),auVar7);
  auVar2 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar6),local_a8);
  auVar10._0_4_ = auVar3._0_4_ / auVar2._0_4_;
  auVar10._4_12_ = auVar3._4_12_;
  auVar2 = vfnmadd213ss_fma(local_a8,ZEXT416((uint)fVar6),auVar7);
  auVar7 = vfmadd213ss_fma(local_a8,ZEXT416((uint)fVar6),auVar7);
  fVar6 = auVar2._0_4_ / auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar10,auVar10);
  local_a8._0_4_ = auVar7._0_4_ * 0.5;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  auVar7 = vcvtusi2sd_avx512f(in_XMM5,rVar5);
  if ((float)(auVar7._0_8_ / 4294967295.0) <= (float)local_a8._0_4_) {
    Vector2f::Vector2f(&local_4c,&hit->pos);
    Texture::get((Texture *)local_b4,(Vector2f *)&this->reflectColor);
    pVVar4 = local_c8;
    ::operator*(local_c8,(Vector3f *)local_b4);
    Vector3f::operator=(pVVar4,&local_d4);
    ::operator*(&local_84,2.0);
    operator-((Vector3f *)v);
    fVar6 = Vector3f::dot(&hit->norm,&local_3c);
    ::operator*(&local_d4,fVar6);
    operator+(&local_d4,(Vector3f *)v);
    Vector3f::normalize((Vector3f *)local_b4);
    ::operator*(&local_d4,hit->t);
    this_01 = local_c0;
    operator+(&local_c0->o,&local_d4);
    Vector3f::operator=(&this_01->o,&local_84);
  }
  else {
    uVar1 = vcmpss_avx512f(ZEXT416(0) << 0x40,ZEXT416((uint)local_78._0_4_),0xe);
    local_98._0_4_ = (uint)!(bool)((byte)uVar1 & 1) * local_98._0_4_;
    Vector2f::Vector2f(&local_44,&hit->pos);
    Texture::get((Texture *)local_b4,(Vector2f *)&this->refractColor);
    pVVar4 = local_c8;
    ::operator*(local_c8,(Vector3f *)local_b4);
    Vector3f::operator=(pVVar4,&local_d4);
    ::operator*(&local_d4,(float)local_98._0_4_ + hit->t);
    v = local_c0;
    operator+(&local_c0->o,&local_d4);
  }
  Vector3f::operator=(&v->o,(Vector3f *)local_b4);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
		float t = thickness;
		if (co < 0) co = -co, t=0;
		float si = sqrtf(std::max(1 - co * co, float(0)));
		float si2 = si * refractCoef;
		float co2 = sqrt(1 - si2 * si2);
		float rs = (refractCoef * co2 - co) / (refractCoef * co2 + co);
		float rp = (co2 - refractCoef * co) / (co2 + refractCoef * co);
		float r = (rs * rs + rp * rp) / 2;
		//cerr << co << " " << r << "\n";
//		r = 0.25 + 0.5 * r;
		//Vector3f i1=ray.d, i2;
		if (randf(g) > r) {
			coe = coe * refractColor.get(hit.pos);
			ray.o = ray.pos(hit.t+ t);
		}
		else {
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np;
		}
		/*
		i2 = ray.d;
		if (Vector3f::dot(i1, -hit.norm) < 0) i1 = -i1;
		if (Vector3f::dot(i2, hit.norm) < 0) i2 = -i2;
		Vector3f b=m->BRDF(i1, i2, hit);*/
		/*
		if (b[0] > 2) b[0] = 2;
		if (b[1] > 2) b[1] = 2;
		if (b[2] > 2) b[2] = 2;*/
		//coe = coe * b; //not actually physical but could work
		return 1;
	}